

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store_register.c
# Opt level: O0

OSSL_STORE_LOADER * ossl_store_get0_loader_int(char *scheme)

{
  int iVar1;
  lhash_st_OSSL_STORE_LOADER *in_RDI;
  OSSL_STORE_LOADER *loader;
  OSSL_STORE_LOADER template;
  lhash_st_OSSL_STORE_LOADER *lh;
  int in_stack_ffffffffffffff2c;
  char *file;
  OSSL_STORE_LOADER *local_8;
  
  local_8 = (OSSL_STORE_LOADER *)0x0;
  file = (char *)0x0;
  lh = in_RDI;
  iVar1 = CRYPTO_THREAD_run_once((CRYPTO_ONCE *)0x0,(_func_void *)0x2cc944);
  if ((iVar1 == 0) || (do_registry_init_ossl_ret_ == 0)) {
    ERR_new();
    ERR_set_debug(file,in_stack_ffffffffffffff2c,(char *)lh);
    ERR_set_error(0x2c,0xc0100,(char *)0x0);
    local_8 = (OSSL_STORE_LOADER *)0x0;
  }
  else {
    iVar1 = CRYPTO_THREAD_write_lock(local_8);
    if (iVar1 == 0) {
      local_8 = (OSSL_STORE_LOADER *)0x0;
    }
    else {
      iVar1 = ossl_store_register_init();
      if (iVar1 == 0) {
        ERR_new();
        ERR_set_debug(file,in_stack_ffffffffffffff2c,(char *)lh);
        ERR_set_error(0x2c,0xc0103,(char *)0x0);
      }
      else {
        local_8 = lh_OSSL_STORE_LOADER_retrieve(lh,local_8);
        if (local_8 == (OSSL_STORE_LOADER *)0x0) {
          ERR_new();
          ERR_set_debug(file,in_stack_ffffffffffffff2c,(char *)lh);
          ERR_set_error(0x2c,0x69,"scheme=%s",in_RDI);
        }
      }
      CRYPTO_THREAD_unlock(local_8);
    }
  }
  return local_8;
}

Assistant:

const OSSL_STORE_LOADER *ossl_store_get0_loader_int(const char *scheme)
{
    OSSL_STORE_LOADER template;
    OSSL_STORE_LOADER *loader = NULL;

    template.scheme = scheme;
    template.open = NULL;
    template.load = NULL;
    template.eof = NULL;
    template.closefn = NULL;
    template.open_ex = NULL;

    if (!RUN_ONCE(&registry_init, do_registry_init)) {
        ERR_raise(ERR_LIB_OSSL_STORE, ERR_R_MALLOC_FAILURE);
        return NULL;
    }
    if (!CRYPTO_THREAD_write_lock(registry_lock))
        return NULL;

    if (!ossl_store_register_init())
        ERR_raise(ERR_LIB_OSSL_STORE, ERR_R_INTERNAL_ERROR);
    else if ((loader = lh_OSSL_STORE_LOADER_retrieve(loader_register,
                                                     &template)) == NULL)
        ERR_raise_data(ERR_LIB_OSSL_STORE, OSSL_STORE_R_UNREGISTERED_SCHEME,
                       "scheme=%s", scheme);

    CRYPTO_THREAD_unlock(registry_lock);

    return loader;
}